

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall anon_unknown.dwarf_49861::JSONParser::parse(JSONParser *this)

{
  pointer *ppSVar1;
  byte bVar2;
  lex_state_e lVar3;
  uint uVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  byte *pbVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Reactor *pRVar9;
  pointer pSVar10;
  pointer pSVar11;
  undefined8 uVar12;
  undefined8 this_00;
  byte bVar13;
  int iVar14;
  parser_state_e pVar15;
  undefined4 extraout_var;
  ulong uVar16;
  JSON *pJVar17;
  runtime_error *prVar18;
  undefined8 *puVar19;
  long *plVar20;
  runtime_error *prVar21;
  logic_error *this_01;
  undefined8 *extraout_RAX;
  char *pcVar22;
  uint uVar23;
  uint *in_RCX;
  long lVar24;
  pointer pSVar25;
  long lVar26;
  size_type *psVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  uint *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  code *pcVar28;
  pointer extraout_RDX_04;
  parser_state_e pVar29;
  JSONParser *in_RSI;
  uint *key;
  undefined *puVar30;
  StackFrame *__cur;
  JSONParser *pJVar31;
  pointer pSVar32;
  bool bVar33;
  JSON JVar34;
  JSON item;
  JSON tos;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  string local_78;
  _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  *local_58;
  JSONParser *local_50;
  vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  *local_48;
  qpdf_offset_t *local_40;
  JSONParser *local_38;
  
  local_38 = this;
  if (in_RSI->done == false) {
    prVar21 = (runtime_error *)&in_RSI->token;
    pcVar22 = in_RSI->buf;
    local_40 = &in_RSI->u_count;
    local_48 = &in_RSI->stack;
    local_50 = (JSONParser *)&in_RSI->dict_key;
    key = (uint *)in_RSI;
    do {
      (in_RSI->token)._M_string_length = 0;
      *(in_RSI->token)._M_dataplus._M_p = '\0';
      lVar26 = 0;
      pJVar31 = (JSONParser *)0x0;
LAB_0012422d:
      if (in_RSI->p != pcVar22 + in_RSI->bytes) {
LAB_00124268:
        pbVar7 = (byte *)in_RSI->p;
        bVar2 = *pbVar7;
        in_RCX = (uint *)(ulong)bVar2;
        uVar23 = (uint)bVar2;
        if (bVar2 < 0x20) {
          if ((1 < bVar2 - 9) && (uVar23 != 0xd)) {
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_e8,in_RSI->offset);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,"JSON: control or null character at offset ",&local_e8);
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar3 = in_RSI->lex_state;
joined_r0x0012428c:
          if (lVar3 == ls_top) {
LAB_00124292:
            in_RSI->p = (char *)(pbVar7 + 1);
            goto LAB_00124383;
          }
          goto LAB_00124701;
        }
        lVar3 = in_RSI->lex_state;
        if (bVar2 < 0x5b) {
          if (uVar23 == 0x20) {
            if (lVar3 != ls_string) goto joined_r0x0012428c;
          }
          else {
            if (uVar23 != 0x2c) {
              if (uVar23 != 0x3a) goto LAB_0012430d;
              if (lVar3 == ls_string) goto LAB_00124371;
              if (lVar3 == ls_top) {
                in_RSI->lex_state = ls_colon;
                goto LAB_001247cc;
              }
              goto LAB_00124701;
            }
            if (lVar3 != ls_string) {
              if (lVar3 == ls_top) {
                in_RSI->lex_state = ls_comma;
LAB_001247cc:
                in_RSI->p = (char *)(pbVar7 + 1);
                in_RSI->offset = in_RSI->offset + 1;
                goto LAB_001247dd;
              }
              goto LAB_00124701;
            }
          }
LAB_00124371:
          key = (uint *)(ulong)(uint)(int)(char)bVar2;
          goto LAB_00124377;
        }
        if (uVar23 != 0x7a && 0x79 < bVar2) {
          if (uVar23 == 0x7b) {
            if (lVar3 == ls_string) goto LAB_00124371;
            if (lVar3 == ls_top) {
              lVar26 = in_RSI->offset;
              in_RSI->token_start = lVar26;
              in_RSI->lex_state = ls_begin_dict;
              goto LAB_00124785;
            }
            goto LAB_00124701;
          }
          if (uVar23 != 0x7d) goto LAB_0012430d;
          if (lVar3 != ls_string) {
            if (lVar3 == ls_top) {
              in_RSI->lex_state = ls_end_dict;
              goto LAB_001247cc;
            }
            goto LAB_00124701;
          }
          goto LAB_00124371;
        }
        if (uVar23 == 0x5b) {
          if (lVar3 == ls_string) goto LAB_00124371;
          if (lVar3 == ls_top) {
            lVar26 = in_RSI->offset;
            in_RSI->token_start = lVar26;
            in_RSI->lex_state = ls_begin_array;
LAB_00124785:
            in_RSI->p = (char *)(pbVar7 + 1);
            in_RCX = (uint *)(lVar26 + 1);
            in_RSI->offset = (qpdf_offset_t)in_RCX;
            goto LAB_001247dd;
          }
          goto LAB_00124701;
        }
        if (uVar23 == 0x5d) {
          if (lVar3 == ls_string) goto LAB_00124371;
          if (lVar3 == ls_top) {
            in_RSI->lex_state = ls_end_array;
            goto LAB_001247cc;
          }
          goto LAB_00124701;
        }
LAB_0012430d:
        if (ls_u4 < lVar3) {
switchD_00124326_caseD_b:
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    ((logic_error *)prVar21,
                     "JSONParser::getToken : trying to handle delimiter state");
          goto LAB_001251a6;
        }
        key = &switchD_00124326::switchdataD_00260ba4;
        uVar4 = (&switchD_00124326::switchdataD_00260ba4)[lVar3];
        switch(lVar3) {
        case ls_top:
          lVar24 = in_RSI->offset;
          in_RSI->token_start = lVar24;
          bVar2 = *pbVar7;
          if (bVar2 != 0x22) {
            if ((byte)(bVar2 + 0x9f) < 0x1a) {
              in_RSI->lex_state = ls_alpha;
            }
            else {
              if (bVar2 != 0x2d) {
                if ((byte)(bVar2 - 0x31) < 9) goto LAB_0012445a;
                if (bVar2 != 0x30) {
                  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::to_string((string *)(local_88 + 0x10),in_RSI->offset);
                  std::operator+(&local_c8,"JSON: offset ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_88 + 0x10));
                  plVar20 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_e8._M_dataplus._M_p = (pointer)*plVar20;
                  psVar27 = (size_type *)(plVar20 + 2);
                  if ((size_type *)local_e8._M_dataplus._M_p == psVar27) {
                    local_e8.field_2._M_allocated_capacity = *psVar27;
                    local_e8.field_2._8_8_ = plVar20[3];
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  }
                  else {
                    local_e8.field_2._M_allocated_capacity = *psVar27;
                  }
                  local_e8._M_string_length = plVar20[1];
                  *plVar20 = (long)psVar27;
                  plVar20[1] = 0;
                  *(undefined1 *)(plVar20 + 2) = 0;
                  pcVar22 = in_RSI->p;
                  local_a8._0_8_ = local_98;
                  if (pcVar22 == (char *)0x0) {
                    pcVar22 = (char *)std::__throw_logic_error
                                                ("basic_string::_M_construct null not valid");
                  }
                  local_98[0] = *pcVar22;
                  local_a8._8_8_ = (element_type *)0x1;
                  local_98[1] = ls_top >> 8;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108,&local_e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8);
                  std::runtime_error::runtime_error(prVar21,(string *)local_108);
                  __cxa_throw(prVar21,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_001244d6;
              }
              in_RSI->lex_state = ls_number_minus;
            }
            break;
          }
          in_RSI->lex_state = ls_string;
          in_RSI->p = (char *)(pbVar7 + 1);
          goto LAB_0012438a;
        case ls_number:
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_00124371;
          goto LAB_001258b4;
        case ls_number_minus:
          if ((byte)(bVar2 - 0x31) < 9) {
LAB_0012445a:
            in_RSI->lex_state = ls_number_before_point;
          }
          else {
            if (uVar23 != 0x30) {
              prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_c8,in_RSI->offset);
              std::operator+(&local_e8,"JSON: offset ",&local_c8);
              plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_108._0_8_ = *plVar20;
              psVar27 = (size_type *)(plVar20 + 2);
              if ((size_type *)local_108._0_8_ == psVar27) {
                local_f8._0_8_ = *psVar27;
                local_f8._8_8_ = plVar20[3];
                local_108._0_8_ = local_f8;
              }
              else {
                local_f8._0_8_ = *psVar27;
              }
              local_108._8_8_ = plVar20[1];
              *plVar20 = (long)psVar27;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              std::runtime_error::runtime_error(prVar21,(string *)local_108);
              __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_001244d6:
            in_RSI->lex_state = ls_number_leading_zero;
          }
          break;
        case ls_number_leading_zero:
          if ((uVar23 == 0x65) || (uVar23 == 0x45)) {
LAB_001244c1:
            in_RSI->lex_state = ls_number_e;
          }
          else {
            if (uVar23 != 0x2e) {
              prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_c8,in_RSI->offset);
              std::operator+(&local_e8,"JSON: offset ",&local_c8);
              plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_108._0_8_ = *plVar20;
              psVar27 = (size_type *)(plVar20 + 2);
              if ((size_type *)local_108._0_8_ == psVar27) {
                local_f8._0_8_ = *psVar27;
                local_f8._8_8_ = plVar20[3];
                local_108._0_8_ = local_f8;
              }
              else {
                local_f8._0_8_ = *psVar27;
              }
              local_108._8_8_ = plVar20[1];
              *plVar20 = (long)psVar27;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              std::runtime_error::runtime_error(prVar21,(string *)local_108);
              __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_0012448d:
            in_RSI->lex_state = ls_number_point;
          }
          break;
        case ls_number_before_point:
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_00124371;
          if ((uVar23 == 0x65) || (uVar23 == 0x45)) goto LAB_001244c1;
          if (uVar23 == 0x2e) goto LAB_0012448d;
          goto LAB_001258b4;
        case ls_number_point:
          in_RCX = (uint *)(ulong)(uVar23 - 0x30);
          if (9 < (byte)(uVar23 - 0x30)) goto LAB_001258b4;
          in_RSI->lex_state = ls_number_after_point;
          break;
        case ls_number_after_point:
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_00124371;
          in_RCX = (uint *)(ulong)(uVar23 | 0x20);
          if ((uVar23 | 0x20) == 0x65) goto LAB_001244c1;
          goto LAB_001258b4;
        case ls_number_e:
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_0012446e;
          if ((uVar23 != 0x2d) && (uVar23 != 0x2b)) goto LAB_001258b4;
          in_RSI->lex_state = ls_number_e_sign;
          break;
        case ls_number_e_sign:
          in_RCX = (uint *)(ulong)(uVar23 - 0x30);
          if (9 < (byte)(uVar23 - 0x30)) goto LAB_001258b4;
LAB_0012446e:
          in_RSI->lex_state = ls_number;
          break;
        case ls_alpha:
          if ((byte)(bVar2 + 0x9f) < 0x1a) goto LAB_00124371;
          goto LAB_001258b4;
        case ls_string:
          if (uVar23 == 0x5c) {
            in_RSI->lex_state = ls_backslash;
            goto LAB_00124292;
          }
          if (uVar23 == 0x22) {
            if (lVar26 != 0) {
              prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_c8,lVar26);
              std::operator+(&local_e8,"JSON: offset ",&local_c8);
              plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_108._0_8_ = *plVar20;
              psVar27 = (size_type *)(plVar20 + 2);
              if ((size_type *)local_108._0_8_ == psVar27) {
                local_f8._0_8_ = *psVar27;
                local_f8._8_8_ = plVar20[3];
                local_108._0_8_ = local_f8;
              }
              else {
                local_f8._0_8_ = *psVar27;
              }
              local_108._8_8_ = plVar20[1];
              *plVar20 = (long)psVar27;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              std::runtime_error::runtime_error(prVar21,(string *)local_108);
              __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            in_RSI->lex_state = ls_after_string;
            goto LAB_001247cc;
          }
          goto LAB_00124371;
        case ls_after_string:
          goto switchD_00124326_caseD_b;
        case ls_backslash:
          in_RSI->lex_state = ls_string;
          bVar2 = *pbVar7;
          in_RCX = (uint *)(ulong)bVar2;
          if (bVar2 < 0x62) {
            if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c))
            goto switchD_0012453a_caseD_1;
            key = (uint *)(ulong)(uint)(int)(char)bVar2;
          }
          else {
            in_RCX = (uint *)(ulong)(bVar2 - 0x6e);
            switch(in_RCX) {
            case (uint *)0x0:
              key = (uint *)0xa;
              break;
            case (uint *)0x1:
            case (uint *)0x2:
            case (uint *)0x3:
            case (uint *)0x5:
switchD_0012453a_caseD_1:
              in_RSI->lex_state = ls_backslash;
              goto LAB_001258b4;
            case (uint *)0x4:
              key = (uint *)0xd;
              break;
            case (uint *)0x6:
              key = (uint *)0x9;
              break;
            case (uint *)0x7:
              in_RSI->lex_state = ls_u4;
              *local_40 = 0;
              local_40[1] = 0;
              goto LAB_0012437c;
            default:
              if (bVar2 == 0x62) {
                key = (uint *)0x8;
              }
              else {
                if (bVar2 != 0x66) goto switchD_0012453a_caseD_1;
                key = (uint *)0xc;
              }
            }
          }
          goto LAB_00124377;
        case ls_u4:
          bVar13 = bVar2 - 0x30;
          if (9 < bVar13) {
            if ((char)bVar2 < 'a') {
              bVar13 = bVar2 - 0x37;
              in_RCX = (uint *)0x10;
              if ((char)bVar2 < 'A') {
                bVar13 = 0x10;
              }
            }
            else {
              bVar13 = bVar2 + 0xa9;
            }
          }
          if (bVar13 < 0x10) {
            uVar16 = in_RSI->u_value << 4;
            key = (uint *)(bVar13 | uVar16);
            in_RSI->u_value = (unsigned_long)key;
            lVar24 = in_RSI->u_count + 1;
            in_RSI->u_count = lVar24;
            if (lVar24 == 4) {
              lVar24 = in_RSI->offset + -5;
              uVar23 = (uint)uVar16 & 0xfc00;
              if (uVar23 == 0xdc00) {
                if (lVar26 != in_RSI->offset + -0xb) {
                  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::to_string(&local_c8,lVar24);
                  std::operator+(&local_e8,"JSON: offset ",&local_c8);
                  plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
                  local_108._0_8_ = *plVar20;
                  psVar27 = (size_type *)(plVar20 + 2);
                  if ((size_type *)local_108._0_8_ == psVar27) {
                    local_f8._0_8_ = *psVar27;
                    local_f8._8_8_ = plVar20[3];
                    local_108._0_8_ = local_f8;
                  }
                  else {
                    local_f8._0_8_ = *psVar27;
                  }
                  local_108._8_8_ = plVar20[1];
                  *plVar20 = (long)psVar27;
                  plVar20[1] = 0;
                  *(undefined1 *)(plVar20 + 2) = 0;
                  std::runtime_error::runtime_error(prVar21,(string *)local_108);
                  __cxa_throw(prVar21,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                QUtil::toUTF8_abi_cxx11_
                          ((string *)local_108,
                           (QUtil *)((ulong)((uint)key & 0x3ff) +
                                     (ulong)(((uint)pJVar31 & 0x3ff) << 10) + 0x10000),
                           (long)&switchD_00124326::switchdataD_00260ba4 + (long)(int)uVar4);
                key = (uint *)local_108._0_8_;
                std::__cxx11::string::_M_append((char *)prVar21,local_108._0_8_);
                if ((JSONParser *)local_108._0_8_ != (JSONParser *)local_f8) {
                  key = (uint *)(local_f8._0_8_ + 1);
                  operator_delete((void *)local_108._0_8_,(ulong)key);
                }
                lVar24 = 0;
              }
              else if (uVar23 == 0xd800) {
                pJVar31 = (JSONParser *)key;
                if (lVar26 != 0) {
                  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::to_string((string *)(local_88 + 0x10),lVar24);
                  std::operator+(&local_c8,"JSON: offset ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_88 + 0x10));
                  plVar20 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_e8._M_dataplus._M_p = (pointer)*plVar20;
                  psVar27 = (size_type *)(plVar20 + 2);
                  if ((size_type *)local_e8._M_dataplus._M_p == psVar27) {
                    local_e8.field_2._M_allocated_capacity = *psVar27;
                    local_e8.field_2._8_8_ = plVar20[3];
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  }
                  else {
                    local_e8.field_2._M_allocated_capacity = *psVar27;
                  }
                  local_e8._M_string_length = plVar20[1];
                  *plVar20 = (long)psVar27;
                  plVar20[1] = 0;
                  *(undefined1 *)(plVar20 + 2) = 0;
                  std::__cxx11::to_string((string *)local_a8,lVar26);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108,&local_e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8);
                  std::runtime_error::runtime_error(prVar21,(string *)local_108);
                  __cxa_throw(prVar21,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                QUtil::toUTF8_abi_cxx11_
                          ((string *)local_108,(QUtil *)key,
                           (long)&switchD_00124326::switchdataD_00260ba4 + (long)(int)uVar4);
                key = (uint *)local_108._0_8_;
                std::__cxx11::string::_M_append((char *)prVar21,local_108._0_8_);
                lVar24 = lVar26;
                if ((JSONParser *)local_108._0_8_ != (JSONParser *)local_f8) {
                  key = (uint *)(local_f8._0_8_ + 1);
                  operator_delete((void *)local_108._0_8_,(ulong)key);
                }
              }
              in_RSI->lex_state = ls_string;
              lVar26 = lVar24;
            }
            goto LAB_0012437c;
          }
          goto LAB_001258b4;
        }
        key = (uint *)(ulong)(uint)(int)(char)*pbVar7;
LAB_00124377:
        std::__cxx11::string::push_back((char)prVar21);
LAB_0012437c:
        in_RSI->p = in_RSI->p + 1;
LAB_00124383:
        lVar24 = in_RSI->offset;
LAB_0012438a:
        in_RCX = (uint *)(lVar24 + 1);
        in_RSI->offset = (qpdf_offset_t)in_RCX;
        goto LAB_0012422d;
      }
      in_RSI->p = pcVar22;
      key = (uint *)pcVar22;
      iVar14 = (*in_RSI->is->_vptr_InputSource[7])(in_RSI->is,pcVar22,0x4000);
      in_RSI->bytes = CONCAT44(extraout_var,iVar14);
      if (CONCAT44(extraout_var,iVar14) != 0) goto LAB_00124268;
      in_RSI->done = true;
LAB_00124701:
      if ((in_RSI->token)._M_string_length != 0) {
        lVar3 = in_RSI->lex_state;
        if (ls_alpha < lVar3) {
LAB_001258b4:
          tokenError(in_RSI);
          puVar19 = extraout_RAX;
          pSVar25 = extraout_RDX_04;
          goto LAB_001258bc;
        }
        in_RCX = (uint *)0x58;
        if ((0x58U >> (lVar3 & (ls_begin_dict|ls_end_array)) & 1) != 0) {
          in_RSI->lex_state = ls_number;
          goto LAB_001247dd;
        }
        in_RCX = (uint *)&DAT_00000202;
        if ((0x202U >> (lVar3 & (ls_begin_dict|ls_end_array)) & 1) == 0) {
          if (lVar3 != ls_top) goto LAB_001258b4;
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    ((logic_error *)prVar21,"tok_start set in ls_top while parsing");
LAB_001251a6:
          puVar30 = &std::logic_error::typeinfo;
          pcVar28 = std::logic_error::~logic_error;
          goto LAB_001253a7;
        }
      }
LAB_001247dd:
      if (in_RSI->lex_state == ls_top) goto LAB_00124f96;
      if (in_RSI->parser_state == ps_done) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string((string *)(local_88 + 0x10),in_RSI->offset);
        std::operator+(&local_c8,"JSON: offset ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_88 + 0x10));
        plVar20 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_e8._M_dataplus._M_p = (pointer)*plVar20;
        psVar27 = (size_type *)(plVar20 + 2);
        if ((size_type *)local_e8._M_dataplus._M_p == psVar27) {
          local_e8.field_2._M_allocated_capacity = *psVar27;
          local_e8.field_2._8_8_ = plVar20[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar27;
        }
        local_e8._M_string_length = plVar20[1];
        *plVar20 = (long)psVar27;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prVar21)
        ;
        std::runtime_error::runtime_error(prVar18,(string *)local_108);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (((anonymous_namespace)::JSONParser::handleToken()::null_item == '\0') &&
         (iVar14 = __cxa_guard_acquire(&(anonymous_namespace)::JSONParser::handleToken()::null_item)
         , iVar14 != 0)) {
        JSON::makeNull();
        key = (uint *)&(anonymous_namespace)::JSONParser::handleToken()::null_item;
        __cxa_atexit(JSON::~JSON,&(anonymous_namespace)::JSONParser::handleToken()::null_item,
                     &__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::JSONParser::handleToken()::null_item);
      }
      local_a8._0_8_ = (JSONParser *)0x0;
      local_a8._8_8_ = (element_type *)0x0;
      pSVar25 = (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pJVar17 = &pSVar25[-1].item;
      if ((in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_start == pSVar25) {
        pJVar17 = (JSON *)&(anonymous_namespace)::JSONParser::handleToken()::null_item;
      }
      local_88._0_8_ =
           (pJVar17->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88._8_8_ =
           (pJVar17->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count + 1;
        }
      }
      lVar3 = in_RSI->lex_state;
      in_RSI->lex_state = ls_top;
      in_RCX = &switchD_0012487b::switchdataD_00260bfc;
      switch(lVar3) {
      case ls_number:
        key = (uint *)prVar21;
        JVar34 = JSON::makeNumber((JSON *)local_108,(string *)prVar21);
        __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
        goto LAB_00124a86;
      default:
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_c8,in_RSI->offset);
        std::operator+(&local_e8,"JSON: offset ",&local_c8);
        plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_108._0_8_ = *plVar20;
        psVar27 = (size_type *)(plVar20 + 2);
        if ((size_type *)local_108._0_8_ == psVar27) {
          local_f8._0_8_ = *psVar27;
          local_f8._8_8_ = plVar20[3];
          local_108._0_8_ = local_f8;
        }
        else {
          local_f8._0_8_ = *psVar27;
        }
        local_108._8_8_ = plVar20[1];
        *plVar20 = (long)psVar27;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::runtime_error::runtime_error(prVar21,(string *)local_108);
        __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case ls_alpha:
        iVar14 = std::__cxx11::string::compare((char *)prVar21);
        if (iVar14 == 0) {
          key = (uint *)0x1;
          JVar34 = JSON::makeBool((JSON *)local_108,true);
          __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        }
        else {
          iVar14 = std::__cxx11::string::compare((char *)prVar21);
          if (iVar14 == 0) {
            key = (uint *)0x0;
            JVar34 = JSON::makeBool((JSON *)local_108,false);
            __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
          }
          else {
            key = (uint *)0x27e67b;
            iVar14 = std::__cxx11::string::compare((char *)prVar21);
            if (iVar14 != 0) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string((string *)(local_88 + 0x10),in_RSI->offset);
              std::operator+(&local_c8,"JSON: offset ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_88 + 0x10));
              plVar20 = (long *)std::__cxx11::string::append((char *)&local_c8);
              local_e8._M_dataplus._M_p = (pointer)*plVar20;
              psVar27 = (size_type *)(plVar20 + 2);
              if ((size_type *)local_e8._M_dataplus._M_p == psVar27) {
                local_e8.field_2._M_allocated_capacity = *psVar27;
                local_e8.field_2._8_8_ = plVar20[3];
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar27;
              }
              local_e8._M_string_length = plVar20[1];
              *plVar20 = (long)psVar27;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,&local_e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             prVar21);
              std::runtime_error::runtime_error(prVar18,(string *)local_108);
              __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            JVar34 = JSON::makeNull();
            __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
          }
        }
        goto LAB_00124a86;
      case ls_after_string:
        if ((in_RSI->parser_state | ps_dict_after_item) != ps_dict_after_comma) {
          key = (uint *)prVar21;
          JVar34 = JSON::makeString((JSON *)local_108,(string *)prVar21);
          __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
          goto LAB_00124a86;
        }
        key = (uint *)prVar21;
        std::__cxx11::string::_M_assign((string *)local_50);
        in_RSI->dict_key_offset = in_RSI->token_start;
        in_RSI->parser_state = ps_dict_after_key;
        break;
      case ls_begin_array:
        JVar34 = JSON::makeArray();
        __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
        goto LAB_00124a86;
      case ls_end_array:
        if ((in_RSI->parser_state & ~ps_dict_begin) != ps_array_begin) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_c8,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_c8);
          plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_108._0_8_ = *plVar20;
          psVar27 = (size_type *)(plVar20 + 2);
          if ((size_type *)local_108._0_8_ == psVar27) {
            local_f8._0_8_ = *psVar27;
            local_f8._8_8_ = plVar20[3];
            local_108._0_8_ = local_f8;
          }
          else {
            local_f8._0_8_ = *psVar27;
          }
          local_108._8_8_ = plVar20[1];
          *plVar20 = (long)psVar27;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::runtime_error::runtime_error(prVar21,(string *)local_108);
          __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_RSI->parser_state =
             (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].state;
        if ((InputSource *)local_88._0_8_ != (InputSource *)0x0) {
          in_RCX = (uint *)in_RSI->offset;
          *(uint **)((InputSource *)local_88._0_8_)->buffer = in_RCX;
        }
        if (in_RSI->reactor != (Reactor *)0x0) {
          key = (uint *)local_88;
          (*in_RSI->reactor->_vptr_Reactor[4])();
        }
        goto LAB_00124a2a;
      case ls_begin_dict:
        JVar34 = JSON::makeDictionary();
        __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
LAB_00124a86:
        this_00 = local_a8._8_8_;
        uVar12 = local_108._8_8_;
        local_a8._0_8_ = local_108._0_8_;
        local_108._0_8_ = (JSONParser *)0x0;
        local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar33 = (element_type *)local_a8._8_8_ != (element_type *)0x0;
        local_a8._8_8_ = (element_type *)uVar12;
        if (bVar33) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          __s = (uint *)extraout_RDX;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          __s = (uint *)extraout_RDX_00;
        }
        if ((JSONParser *)local_a8._0_8_ != (JSONParser *)0x0) {
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8._0_8_ + 8))->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI->token_start;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8._0_8_ + 0x10))->_M_allocated_capacity = in_RSI->offset;
        }
        pSVar25 = (pointer)(ulong)in_RSI->parser_state;
        in_RCX = (uint *)pSVar25;
        if (pSVar25 < (pointer)0xa) {
          __s = &switchD_00124af2::switchdataD_00260c48;
          in_RCX = (uint *)((long)&switchD_00124af2::switchdataD_00260c48 +
                           (long)(int)(&switchD_00124af2::switchdataD_00260c48)[(long)pSVar25]);
          switch(pSVar25) {
          case (pointer)0x0:
            if ((JSONParser *)local_a8._0_8_ == (JSONParser *)0x0) {
LAB_00124c27:
              pSVar25 = (in_RSI->stack).
                        super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pSVar25 ==
                  (in_RSI->stack).
                  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_58 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                            *)std::
                              vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                              ::_M_check_len(local_48,(size_type)key,
                                             (char *)&switchD_00124af2::switchdataD_00260c48);
                pSVar10 = (in_RSI->stack).
                          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pSVar11 = (in_RSI->stack).
                          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                key = &std::
                       _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                       ::_M_allocate(local_58,(size_t)key)->state;
                in_RCX = (uint *)((long)pSVar25 - (long)pSVar10);
                *(undefined4 *)((long)key + (long)in_RCX) = 9;
                *(undefined8 *)((long)&((JSONParser *)key)->reactor + (long)in_RCX) = local_a8._0_8_
                ;
                *(undefined8 *)((long)&((JSONParser *)key)->lex_state + (long)in_RCX) =
                     local_a8._8_8_;
                pSVar32 = pSVar10;
                pJVar31 = (JSONParser *)key;
                if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
                  in_RCX = (uint *)&__libc_single_threaded;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                  }
                }
                for (; pSVar32 != pSVar25; pSVar32 = pSVar32 + 1) {
                  *(parser_state_e *)&((_Alloc_hider *)&pJVar31->is)->_M_p = pSVar32->state;
                  pJVar31->reactor =
                       (Reactor *)
                       (pSVar32->item).m.
                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&pJVar31->lex_state)->_M_allocated_capacity = 0;
                  in_RCX = (uint *)(pSVar32->item).m.
                                   super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi;
                  (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&pJVar31->lex_state)->_M_allocated_capacity = (size_type)in_RCX;
                  (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  pJVar31 = (JSONParser *)(pJVar31->buf + 4);
                }
                pSVar32 = (pointer)(pJVar31->buf + 4);
                if (pSVar11 != pSVar25) {
                  in_RCX = (uint *)0x0;
                  do {
                    pSVar32->state = pSVar25->state;
                    (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (pSVar25->item).m.
                             super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var8 = (pSVar25->item).m.
                             super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var8;
                    (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    pSVar25 = pSVar25 + 1;
                    pSVar32 = pSVar32 + 1;
                  } while (pSVar25 != pSVar11);
                }
                if (pSVar10 != (pointer)0x0) {
                  operator_delete(pSVar10,(long)(in_RSI->stack).
                                                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)pSVar10);
                }
                (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)key;
                (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish = pSVar32;
                (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(((JSONParser *)key)->buf + (long)local_58 * 0x18 + -0x14);
              }
              else {
                pSVar25->state = ps_done;
                (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)local_a8._0_8_;
                (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
                if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
                  in_RCX = (uint *)&__libc_single_threaded;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                  }
                }
                ppSVar1 = &(in_RSI->stack).
                           super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
              }
              in_RSI->parser_state = ps_done;
              goto LAB_00124f75;
            }
            uVar23 = *(int *)(*(long *)local_a8._0_8_ + 8) - 1;
            in_RCX = (uint *)(ulong)uVar23;
            pVar29 = ps_done;
            if (1 < uVar23) goto LAB_00124c27;
            goto LAB_00124b9c;
          default:
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = local_f8;
            pSVar25 = (pointer)*puVar19;
            in_RCX = (uint *)(puVar19 + 2);
            if (pSVar25 == (pointer)in_RCX) {
              local_f8._0_8_ = *(undefined8 *)in_RCX;
              local_f8._8_8_ = puVar19[3];
            }
            else {
LAB_001258bc:
              local_f8._0_8_ = *(undefined8 *)in_RCX;
              local_108._0_8_ = pSVar25;
            }
            local_108._8_8_ = puVar19[1];
            *puVar19 = in_RCX;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case (pointer)0x2:
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = *plVar20;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((size_type *)local_108._0_8_ == psVar27) {
              local_f8._0_8_ = *psVar27;
              local_f8._8_8_ = plVar20[3];
              local_108._0_8_ = local_f8;
            }
            else {
              local_f8._0_8_ = *psVar27;
            }
            local_108._8_8_ = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case (pointer)0x3:
            pRVar9 = in_RSI->reactor;
            if (pRVar9 != (Reactor *)0x0) {
              key = (uint *)local_50;
              iVar14 = (*pRVar9->_vptr_Reactor[6])(pRVar9,local_50,local_a8);
              pVar29 = ps_dict_after_item;
              __s = (uint *)extraout_RDX_02;
              if ((char)iVar14 != '\0') goto LAB_00124b9c;
            }
            key = (uint *)local_88;
            in_RCX = (uint *)local_a8;
            JVar34 = JSON::addDictionaryMember
                               ((JSON *)(local_88 + 0x10),(string *)key,(JSON *)local_50);
            __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
            pVar29 = ps_dict_after_item;
            break;
          case (pointer)0x4:
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = *plVar20;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((size_type *)local_108._0_8_ == psVar27) {
              local_f8._0_8_ = *psVar27;
              local_f8._8_8_ = plVar20[3];
              local_108._0_8_ = local_f8;
            }
            else {
              local_f8._0_8_ = *psVar27;
            }
            local_108._8_8_ = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case (pointer)0x6:
          case (pointer)0x8:
            if (in_RSI->reactor != (Reactor *)0x0) {
              key = (uint *)local_a8;
              iVar14 = (*in_RSI->reactor->_vptr_Reactor[7])();
              pVar29 = ps_array_after_item;
              __s = (uint *)extraout_RDX_01;
              if ((char)iVar14 != '\0') goto LAB_00124b9c;
            }
            key = (uint *)local_88;
            JVar34 = JSON::addArrayElement((JSON *)(local_88 + 0x10),(JSON *)key);
            __s = JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
            pVar29 = ps_array_after_item;
            break;
          case (pointer)0x7:
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = *plVar20;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((size_type *)local_108._0_8_ == psVar27) {
              local_f8._0_8_ = *psVar27;
              local_f8._8_8_ = plVar20[3];
              local_108._0_8_ = local_f8;
            }
            else {
              local_f8._0_8_ = *psVar27;
            }
            local_108._8_8_ = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case (pointer)0x9:
            this_01 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (this_01,"JSONParser::handleToken: unexpected parser state");
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
            __s = (uint *)extraout_RDX_03;
          }
LAB_00124b9c:
          in_RSI->parser_state = pVar29;
        }
        if (((JSONParser *)local_a8._0_8_ != (JSONParser *)0x0) &&
           (uVar23 = *(int *)(*(long *)local_a8._0_8_ + 8) - 1, in_RCX = (uint *)(ulong)uVar23,
           uVar23 < 2)) {
          pSVar25 = (in_RSI->stack).
                    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar25 ==
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                        *)std::
                          vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                          ::_M_check_len(local_48,(size_type)key,(char *)__s);
            pSVar10 = (in_RSI->stack).
                      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar11 = (in_RSI->stack).
                      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            key = &std::
                   _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   ::_M_allocate(local_58,(size_t)key)->state;
            lVar26 = (long)pSVar25 - (long)pSVar10;
            *(parser_state_e *)((long)key + lVar26) = in_RSI->parser_state;
            *(undefined8 *)((long)key + lVar26 + 8) = local_a8._0_8_;
            *(undefined8 *)((long)key + lVar26 + 0x10) = local_a8._8_8_;
            pSVar32 = pSVar10;
            pJVar31 = (JSONParser *)key;
            if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
              }
            }
            for (; pSVar32 != pSVar25; pSVar32 = pSVar32 + 1) {
              *(parser_state_e *)&((_Alloc_hider *)&pJVar31->is)->_M_p = pSVar32->state;
              pJVar31->reactor =
                   (Reactor *)
                   (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&pJVar31->lex_state)->_M_allocated_capacity = 0;
              p_Var8 = (pSVar32->item).m.
                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&pJVar31->lex_state)->_M_allocated_capacity = (size_type)p_Var8;
              (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              pJVar31 = (JSONParser *)(pJVar31->buf + 4);
            }
            pSVar32 = (pointer)(pJVar31->buf + 4);
            for (; pSVar11 != pSVar25; pSVar25 = pSVar25 + 1) {
              pSVar32->state = pSVar25->state;
              (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (pSVar25->item).m.
                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = p_Var8;
              (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              pSVar32 = pSVar32 + 1;
            }
            if (pSVar10 != (pointer)0x0) {
              operator_delete(pSVar10,(long)(in_RSI->stack).
                                            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pSVar10);
            }
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)key;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar32;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(((JSONParser *)key)->buf + (long)local_58 * 0x18 + -0x14);
          }
          else {
            pSVar25->state = in_RSI->parser_state;
            (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_a8._0_8_;
            (pSVar25->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
            if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_a8._8_8_ + 8) = (int)*(qpdf_offset_t *)(local_a8._8_8_ + 8) + 1;
              }
            }
            ppSVar1 = &(in_RSI->stack).
                       super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          if ((JSONParser *)local_a8._0_8_ != (JSONParser *)0x0) {
            if (*(int *)(*(long *)local_a8._0_8_ + 8) == 2) {
              pVar29 = ps_array_begin;
              if (in_RSI->reactor != (Reactor *)0x0) {
                (*in_RSI->reactor->_vptr_Reactor[3])();
              }
            }
            else {
              if (*(int *)(*(long *)local_a8._0_8_ + 8) != 1) goto LAB_00124e6e;
              pVar29 = ps_dict_begin;
              if (in_RSI->reactor != (Reactor *)0x0) {
                (*in_RSI->reactor->_vptr_Reactor[2])();
              }
            }
            in_RSI->parser_state = pVar29;
          }
LAB_00124e6e:
          in_RCX = (uint *)0xaaaaaaaaaaaaaaab;
          if (500 < (ulong)(((long)(in_RSI->stack).
                                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_RSI->stack).
                                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555)) {
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = *plVar20;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((size_type *)local_108._0_8_ == psVar27) {
              local_f8._0_8_ = *psVar27;
              local_f8._8_8_ = plVar20[3];
              local_108._0_8_ = local_f8;
            }
            else {
              local_f8._0_8_ = *psVar27;
            }
            local_108._8_8_ = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        break;
      case ls_end_dict:
        if ((in_RSI->parser_state != ps_dict_begin) && (in_RSI->parser_state != ps_dict_after_item))
        {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_c8,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_c8);
          plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_108._0_8_ = *plVar20;
          psVar27 = (size_type *)(plVar20 + 2);
          if ((size_type *)local_108._0_8_ == psVar27) {
            local_f8._0_8_ = *psVar27;
            local_f8._8_8_ = plVar20[3];
            local_108._0_8_ = local_f8;
          }
          else {
            local_f8._0_8_ = *psVar27;
          }
          local_108._8_8_ = plVar20[1];
          *plVar20 = (long)psVar27;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::runtime_error::runtime_error(prVar21,(string *)local_108);
          __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_RSI->parser_state =
             (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].state;
        if ((InputSource *)local_88._0_8_ != (InputSource *)0x0) {
          in_RCX = (uint *)in_RSI->offset;
          *(uint **)((InputSource *)local_88._0_8_)->buffer = in_RCX;
        }
        if (in_RSI->reactor != (Reactor *)0x0) {
          key = (uint *)local_88;
          (*in_RSI->reactor->_vptr_Reactor[4])();
        }
LAB_00124a2a:
        if (in_RSI->parser_state != ps_done) {
          pSVar25 = (in_RSI->stack).
                    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          in_RCX = &pSVar25[-1].state;
          (in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
          p_Var8 = pSVar25[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
        }
        break;
      case ls_colon:
        if (in_RSI->parser_state != ps_dict_after_key) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_c8,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_c8);
          plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_108._0_8_ = *plVar20;
          psVar27 = (size_type *)(plVar20 + 2);
          if ((size_type *)local_108._0_8_ == psVar27) {
            local_f8._0_8_ = *psVar27;
            local_f8._8_8_ = plVar20[3];
            local_108._0_8_ = local_f8;
          }
          else {
            local_f8._0_8_ = *psVar27;
          }
          local_108._8_8_ = plVar20[1];
          *plVar20 = (long)psVar27;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::runtime_error::runtime_error(prVar21,(string *)local_108);
          __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_RSI->parser_state = ps_dict_after_colon;
        break;
      case ls_comma:
        pVar29 = in_RSI->parser_state;
        in_RCX = (uint *)(ulong)pVar29;
        pVar15 = ps_dict_after_comma;
        if (pVar29 != ps_dict_after_item) {
          if (pVar29 != ps_array_after_item) {
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_c8,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_c8);
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108._0_8_ = *plVar20;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((size_type *)local_108._0_8_ == psVar27) {
              local_f8._0_8_ = *psVar27;
              local_f8._8_8_ = plVar20[3];
              local_108._0_8_ = local_f8;
            }
            else {
              local_f8._0_8_ = *psVar27;
            }
            local_108._8_8_ = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            std::runtime_error::runtime_error(prVar21,(string *)local_108);
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pVar15 = ps_array_after_comma;
        }
        in_RSI->parser_state = pVar15;
      }
LAB_00124f75:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
LAB_00124f96:
    } while (in_RSI->done != true);
  }
  if (in_RSI->parser_state == ps_done) {
    pSVar25 = (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((in_RSI->reactor != (Reactor *)0x0) &&
       ((peVar5 = pSVar25[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, peVar5 == (element_type *)0x0 ||
        ((*(int *)((long)(peVar5->value)._M_t.
                         super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
                         ._M_t + 8) != 2 &&
         ((peVar5 == (element_type *)0x0 ||
          (*(int *)((long)(peVar5->value)._M_t.
                          super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
                          ._M_t + 8) != 1)))))))) {
      (*in_RSI->reactor->_vptr_Reactor[5])();
    }
    local_38->is = (InputSource *)
                   pSVar25[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    _Var6._M_pi = pSVar25[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_38->reactor = (Reactor *)_Var6._M_pi;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
      }
    }
    JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_38;
    return (JSON)JVar34.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar21,"JSON: premature end of input");
  puVar30 = &std::runtime_error::typeinfo;
  pcVar28 = std::runtime_error::~runtime_error;
LAB_001253a7:
  __cxa_throw(prVar21,puVar30,pcVar28);
}

Assistant:

JSON
JSONParser::parse()
{
    while (!done) {
        getToken();
        handleToken();
    }
    if (parser_state != ps_done) {
        QTC::TC("libtests", "JSON parse premature EOF");
        throw std::runtime_error("JSON: premature end of input");
    }
    auto const& tos = stack.back().item;
    if (reactor && !(tos.isArray() || tos.isDictionary())) {
        reactor->topLevelScalar();
    }
    return tos;
}